

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

WeakDiagStack * __thiscall
Js::ProbeContainer::GetFramePointers(ProbeContainer *this,DWORD_PTR dispatchHaltFrameAddress)

{
  uint uVar1;
  DebugManager *this_00;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  DiagStackFrame **ppDVar5;
  HeapAllocator *alloc;
  WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
  *this_01;
  TrackAllocData local_48;
  ReferencedArenaAdapter *local_20;
  ReferencedArenaAdapter *pRefArena;
  DWORD_PTR dispatchHaltFrameAddress_local;
  ProbeContainer *this_local;
  
  pRefArena = (ReferencedArenaAdapter *)dispatchHaltFrameAddress;
  dispatchHaltFrameAddress_local = (DWORD_PTR)this;
  if ((this->framePointers == (DiagStack *)0x0) ||
     (uVar1 = this->debugSessionNumber,
     uVar3 = DebugManager::GetDebugSessionNumber(this->debugManager), uVar1 < uVar3)) {
    UpdateFramePointers(this,true,(DWORD_PTR)pRefArena);
    uVar3 = DebugManager::GetDebugSessionNumber(this->debugManager);
    this->debugSessionNumber = uVar3;
    iVar4 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
            Count(this->framePointers);
    if (0 < iVar4) {
      this_00 = this->debugManager;
      ppDVar5 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>
                ::Peek(this->framePointers,0);
      bVar2 = DebugManager::IsMatchTopFrameStackAddress(this_00,*ppDVar5);
      if (bVar2) {
        ppDVar5 = JsUtil::
                  Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Peek
                            (this->framePointers,0);
        DiagStackFrame::SetIsTopFrame(*ppDVar5);
      }
    }
  }
  local_20 = DebugManager::GetDiagnosticArena(this->debugManager);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,
             (type_info *)
             &Memory::
              WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame*,Memory::ArenaAllocator,false,DefaultComparer>>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
             ,0xc0);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  this_01 = (WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
             *)new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
  Memory::
  WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
  ::WeakArenaReference(this_01,local_20,this->framePointers);
  return this_01;
}

Assistant:

WeakDiagStack * ProbeContainer::GetFramePointers(DWORD_PTR dispatchHaltFrameAddress)
    {
        if (framePointers == nullptr || this->debugSessionNumber < debugManager->GetDebugSessionNumber())
        {
            UpdateFramePointers(/*fMatchWithCurrentScriptContext*/true, dispatchHaltFrameAddress);
            this->debugSessionNumber = debugManager->GetDebugSessionNumber();

            if ((framePointers->Count() > 0) &&
                debugManager->IsMatchTopFrameStackAddress(framePointers->Peek(0)))
            {
                framePointers->Peek(0)->SetIsTopFrame();
            }
        }

        ReferencedArenaAdapter* pRefArena = debugManager->GetDiagnosticArena();
        return HeapNew(WeakDiagStack,pRefArena,framePointers);
    }